

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UMatchDegree __thiscall
icu_63::UnicodeSet::matches
          (UnicodeSet *this,Replaceable *text,int32_t *offset,int32_t limit,UBool incremental)

{
  ushort uVar1;
  short sVar2;
  uint uVar3;
  uint uVar4;
  UBool UVar5;
  UMatchDegree UVar6;
  int iVar7;
  int32_t iVar8;
  UnicodeString *s;
  char16_t *pcVar9;
  uint uVar10;
  int iVar11;
  int32_t iVar12;
  int32_t iVar13;
  int iVar14;
  char16_t cVar15;
  uint uVar16;
  UVector *this_00;
  int index;
  
  uVar3 = *offset;
  if (uVar3 == limit) {
    UVar5 = contains(this,0xffff);
    if (UVar5 == '\0') {
      UVar6 = U_MISMATCH;
    }
    else {
      UVar6 = (incremental == '\0') + U_PARTIAL_MATCH;
    }
    return UVar6;
  }
  if (this->strings->count != 0) {
    iVar7 = (*(text->super_UObject)._vptr_UObject[9])(text,(ulong)uVar3);
    this_00 = this->strings;
    if (0 < this_00->count) {
      index = 0;
      iVar14 = 0;
      do {
        s = (UnicodeString *)UVector::elementAt(this_00,index);
        uVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
        if ((int)uVar3 < limit) {
          uVar16 = (s->fUnion).fFields.fLength;
          uVar10 = 0;
        }
        else {
          uVar16 = (s->fUnion).fFields.fLength;
          uVar10 = (int)(short)uVar1 >> 5;
          if ((short)uVar1 < 0) {
            uVar10 = uVar16;
          }
          uVar10 = uVar10 - 1;
        }
        uVar4 = (int)(short)uVar1 >> 5;
        if ((short)uVar1 < 0) {
          uVar4 = uVar16;
        }
        cVar15 = L'\xffff';
        if (uVar10 < uVar4) {
          if ((uVar1 & 2) == 0) {
            pcVar9 = (s->fUnion).fFields.fArray;
          }
          else {
            pcVar9 = (char16_t *)((long)&s->fUnion + 2);
          }
          cVar15 = pcVar9[(int)uVar10];
        }
        iVar13 = iVar14;
        if (((int)uVar3 < limit) && ((ushort)(char16_t)iVar7 < (ushort)cVar15)) break;
        if (cVar15 == (char16_t)iVar7) {
          iVar8 = matchRest(text,*offset,limit,s);
          if (incremental != '\0') {
            iVar11 = *offset - limit;
            if ((int)uVar3 < limit) {
              iVar11 = limit - *offset;
            }
            if (iVar8 == iVar11) {
              return U_PARTIAL_MATCH;
            }
          }
          sVar2 = (s->fUnion).fStackFields.fLengthAndFlags;
          if (sVar2 < 0) {
            iVar12 = (s->fUnion).fFields.fLength;
          }
          else {
            iVar12 = (int)sVar2 >> 5;
          }
          if (iVar8 == iVar12) {
            if (iVar14 < iVar8) {
              iVar13 = iVar8;
            }
            if (((int)uVar3 < limit) && (iVar8 < iVar14)) break;
          }
        }
        index = index + 1;
        this_00 = this->strings;
        iVar14 = iVar13;
      } while (index < this_00->count);
      if (iVar13 != 0) {
        iVar7 = -iVar13;
        if ((int)uVar3 < limit) {
          iVar7 = iVar13;
        }
        *offset = *offset + iVar7;
        return U_MATCH;
      }
    }
  }
  UVar6 = UnicodeFilter::matches(&this->super_UnicodeFilter,text,offset,limit,incremental);
  return UVar6;
}

Assistant:

UMatchDegree UnicodeSet::matches(const Replaceable& text,
                                 int32_t& offset,
                                 int32_t limit,
                                 UBool incremental) {
    if (offset == limit) {
        // Strings, if any, have length != 0, so we don't worry
        // about them here.  If we ever allow zero-length strings
        // we much check for them here.
        if (contains(U_ETHER)) {
            return incremental ? U_PARTIAL_MATCH : U_MATCH;
        } else {
            return U_MISMATCH;
        }
    } else {
        if (strings->size() != 0) { // try strings first

            // might separate forward and backward loops later
            // for now they are combined

            // TODO Improve efficiency of this, at least in the forward
            // direction, if not in both.  In the forward direction we
            // can assume the strings are sorted.

            int32_t i;
            UBool forward = offset < limit;

            // firstChar is the leftmost char to match in the
            // forward direction or the rightmost char to match in
            // the reverse direction.
            UChar firstChar = text.charAt(offset);

            // If there are multiple strings that can match we
            // return the longest match.
            int32_t highWaterLength = 0;

            for (i=0; i<strings->size(); ++i) {
                const UnicodeString& trial = *(const UnicodeString*)strings->elementAt(i);

                //if (trial.length() == 0) {
                //    return U_MATCH; // null-string always matches
                //}
                // assert(trial.length() != 0); // We ensure this elsewhere

                UChar c = trial.charAt(forward ? 0 : trial.length() - 1);

                // Strings are sorted, so we can optimize in the
                // forward direction.
                if (forward && c > firstChar) break;
                if (c != firstChar) continue;

                int32_t matchLen = matchRest(text, offset, limit, trial);

                if (incremental) {
                    int32_t maxLen = forward ? limit-offset : offset-limit;
                    if (matchLen == maxLen) {
                        // We have successfully matched but only up to limit.
                        return U_PARTIAL_MATCH;
                    }
                }

                if (matchLen == trial.length()) {
                    // We have successfully matched the whole string.
                    if (matchLen > highWaterLength) {
                        highWaterLength = matchLen;
                    }
                    // In the forward direction we know strings
                    // are sorted so we can bail early.
                    if (forward && matchLen < highWaterLength) {
                        break;
                    }
                    continue;
                }
            }

            // We've checked all strings without a partial match.
            // If we have full matches, return the longest one.
            if (highWaterLength != 0) {
                offset += forward ? highWaterLength : -highWaterLength;
                return U_MATCH;
            }
        }
        return UnicodeFilter::matches(text, offset, limit, incremental);
    }
}